

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_ssse3.c
# Opt level: O2

void av1_highbd_convolve_x_sr_ssse3
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params,
               int bd)

{
  uint16_t uVar1;
  undefined1 (*pauVar5) [32];
  int16_t *piVar6;
  __m128i alVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  uint uVar22;
  undefined1 (*pauVar23) [16];
  ulong uVar24;
  uint uVar25;
  long lVar26;
  undefined1 (*pauVar27) [16];
  ulong uVar28;
  uint16_t *puVar29;
  uint uVar30;
  ulong uVar31;
  bool bVar32;
  short sVar33;
  ushort uVar34;
  int iVar35;
  int extraout_XMM0_Da;
  undefined8 extraout_XMM0_Qa;
  short sVar38;
  ushort uVar39;
  short sVar40;
  ushort uVar41;
  int extraout_XMM0_Db;
  short sVar42;
  ushort uVar43;
  ushort uVar44;
  int extraout_XMM0_Dc;
  ushort uVar45;
  ushort uVar46;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined8 extraout_XMM0_Qb;
  int extraout_XMM0_Dd;
  ushort uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  short sVar52;
  short sVar55;
  short sVar56;
  short sVar57;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  uint16_t *local_1d0;
  int local_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  short local_178;
  short sStack_176;
  __m128i s [6];
  __m128i coeffs_x [6];
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  
  uVar34 = filter_params_x->taps;
  uVar30 = 7 - conv_params->round_0;
  uVar25 = 0xff;
  if (bd == 0xc) {
    uVar25 = 0xfff;
  }
  uVar22 = 0x3ff;
  if (bd != 10) {
    uVar22 = uVar25;
  }
  auVar48 = ZEXT416((uint)conv_params->round_0);
  auVar49 = ZEXT416(uVar30);
  iVar35 = (1 << ((byte)conv_params->round_0 & 0x1f)) >> 1;
  auVar36._0_4_ = (1 << ((byte)uVar30 & 0x1f)) >> 1;
  auVar36._4_4_ = auVar36._0_4_;
  auVar36._8_4_ = auVar36._0_4_;
  auVar36._12_4_ = auVar36._0_4_;
  auVar37 = pshuflw(auVar36,ZEXT416(uVar22),0);
  local_178 = auVar37._0_2_;
  sStack_176 = auVar37._2_2_;
  if (uVar34 == 0xc) {
    prepare_coeffs_12tap(filter_params_x,subpel_x_qn,coeffs_x);
    if (h < 1) {
      h = 0;
    }
    pauVar27 = (undefined1 (*) [16])(src + (0x11 - (ulong)(uint)(uVar34 >> 1)));
    lVar26 = 0;
    local_1d0 = dst;
    while (lVar26 < w) {
      pauVar23 = pauVar27;
      uVar31 = (ulong)(uint)h;
      puVar29 = local_1d0;
      while (bVar32 = uVar31 != 0, uVar31 = uVar31 - 1, bVar32) {
        pauVar5 = (undefined1 (*) [32])(pauVar23 + -2);
        s[0] = *(__m128i *)*pauVar5;
        alVar7 = *(__m128i *)(pauVar23 + -1);
        auVar14 = *pauVar5;
        auVar13 = *pauVar5;
        auVar12 = *pauVar5;
        auVar11 = *pauVar5;
        auVar37 = *pauVar23;
        s[1] = SUB3216(*pauVar5,4);
        s[2] = SUB3216(*pauVar5,8);
        s[3] = SUB3216(*pauVar5,0xc);
        auVar8._16_16_ = auVar37;
        auVar8._0_8_ = alVar7[0];
        auVar8._8_8_ = alVar7[1];
        s[5] = auVar8._4_16_;
        s[4] = alVar7;
        convolve_12tap(s,coeffs_x);
        s[0] = auVar11._2_16_;
        s[1] = auVar12._6_16_;
        s[2] = auVar13._10_16_;
        s[3] = auVar14._14_16_;
        auVar9._16_16_ = auVar37;
        auVar9._0_8_ = alVar7[0];
        auVar9._8_8_ = alVar7[1];
        s[4] = auVar9._2_16_;
        auVar10._16_16_ = auVar37;
        auVar10._0_8_ = alVar7[0];
        auVar10._8_8_ = alVar7[1];
        s[5] = auVar10._6_16_;
        convolve_12tap(s,coeffs_x);
        local_1c8 = (int)extraout_XMM0_Qa;
        iStack_1c4 = (int)((ulong)extraout_XMM0_Qa >> 0x20);
        iStack_1c0 = (int)extraout_XMM0_Qb;
        iStack_1bc = (int)((ulong)extraout_XMM0_Qb >> 0x20);
        auVar58._0_4_ = (local_1c8 + iVar35 >> auVar48) + auVar36._0_4_ >> auVar49;
        auVar58._4_4_ = (iStack_1c4 + iVar35 >> auVar48) + auVar36._0_4_ >> auVar49;
        auVar58._8_4_ = (iStack_1c0 + iVar35 >> auVar48) + auVar36._0_4_ >> auVar49;
        auVar58._12_4_ = (iStack_1bc + iVar35 >> auVar48) + auVar36._0_4_ >> auVar49;
        auVar53 = packssdw(auVar58,auVar58);
        auVar54._0_4_ = (extraout_XMM0_Da + iVar35 >> auVar48) + auVar36._0_4_ >> auVar49;
        auVar54._4_4_ = (extraout_XMM0_Db + iVar35 >> auVar48) + auVar36._0_4_ >> auVar49;
        auVar54._8_4_ = (extraout_XMM0_Dc + iVar35 >> auVar48) + auVar36._0_4_ >> auVar49;
        auVar54._12_4_ = (extraout_XMM0_Dd + iVar35 >> auVar48) + auVar36._0_4_ >> auVar49;
        auVar37 = packssdw(auVar54,auVar54);
        sVar42 = auVar37._6_2_;
        sVar57 = auVar53._6_2_;
        sVar40 = auVar37._4_2_;
        sVar56 = auVar53._4_2_;
        sVar38 = auVar37._2_2_;
        sVar55 = auVar53._2_2_;
        sVar33 = auVar37._0_2_;
        sVar52 = auVar53._0_2_;
        uVar34 = (ushort)(local_178 < sVar52) * local_178 | (ushort)(local_178 >= sVar52) * sVar52;
        uVar39 = (ushort)(sStack_176 < sVar33) * sStack_176 |
                 (ushort)(sStack_176 >= sVar33) * sVar33;
        uVar41 = (ushort)(local_178 < sVar55) * local_178 | (ushort)(local_178 >= sVar55) * sVar55;
        uVar43 = (ushort)(sStack_176 < sVar38) * sStack_176 |
                 (ushort)(sStack_176 >= sVar38) * sVar38;
        uVar44 = (ushort)(local_178 < sVar56) * local_178 | (ushort)(local_178 >= sVar56) * sVar56;
        uVar45 = (ushort)(sStack_176 < sVar40) * sStack_176 |
                 (ushort)(sStack_176 >= sVar40) * sVar40;
        uVar46 = (ushort)(local_178 < sVar57) * local_178 | (ushort)(local_178 >= sVar57) * sVar57;
        uVar47 = (ushort)(sStack_176 < sVar42) * sStack_176 |
                 (ushort)(sStack_176 >= sVar42) * sVar42;
        uVar1 = (-1 < (short)uVar34) * uVar34;
        uVar2 = (-1 < (short)uVar39) * uVar39;
        uVar3 = (-1 < (short)uVar41) * uVar41;
        uVar4 = (-1 < (short)uVar43) * uVar43;
        if (lVar26 < (long)w + -4) {
          *puVar29 = uVar1;
          puVar29[1] = uVar2;
          puVar29[2] = uVar3;
          puVar29[3] = uVar4;
          puVar29[4] = (-1 < (short)uVar44) * uVar44;
          puVar29[5] = (-1 < (short)uVar45) * uVar45;
          puVar29[6] = (-1 < (short)uVar46) * uVar46;
          puVar29[7] = (-1 < (short)uVar47) * uVar47;
        }
        else if (w == 4) {
          *puVar29 = uVar1;
          puVar29[1] = uVar2;
          puVar29[2] = uVar3;
          puVar29[3] = uVar4;
        }
        else {
          *puVar29 = uVar1;
          puVar29[1] = uVar2;
        }
        pauVar23 = (undefined1 (*) [16])(*pauVar23 + (long)src_stride * 2);
        puVar29 = puVar29 + dst_stride;
      }
      pauVar27 = pauVar27 + 1;
      local_1d0 = local_1d0 + 8;
      lVar26 = lVar26 + 8;
    }
  }
  else {
    piVar6 = filter_params_x->filter_ptr + (subpel_x_qn & 0xfU) * (uint)uVar34;
    uVar18 = *(undefined4 *)piVar6;
    uVar19 = *(undefined4 *)(piVar6 + 2);
    uVar20 = *(undefined4 *)(piVar6 + 4);
    uVar21 = *(undefined4 *)(piVar6 + 6);
    auVar37._4_4_ = uVar18;
    auVar37._0_4_ = uVar18;
    auVar37._8_4_ = uVar18;
    auVar37._12_4_ = uVar18;
    auVar53._4_4_ = uVar19;
    auVar53._0_4_ = uVar19;
    auVar53._8_4_ = uVar19;
    auVar53._12_4_ = uVar19;
    auVar50._4_4_ = uVar20;
    auVar50._0_4_ = uVar20;
    auVar50._8_4_ = uVar20;
    auVar50._12_4_ = uVar20;
    auVar51._4_4_ = uVar21;
    auVar51._0_4_ = uVar21;
    auVar51._8_4_ = uVar21;
    auVar51._12_4_ = uVar21;
    uVar31 = (ulong)(uint)h;
    if (h < 1) {
      uVar31 = 0;
    }
    pauVar27 = (undefined1 (*) [16])((long)src + (0x12 - (ulong)((uint)(uVar34 >> 1) * 2)));
    uVar28 = 0;
    while ((long)uVar28 < (long)w) {
      uVar24 = uVar31;
      puVar29 = dst;
      pauVar23 = pauVar27;
      while (bVar32 = uVar24 != 0, uVar24 = uVar24 - 1, bVar32) {
        auVar54 = pauVar23[-1];
        auVar58 = *pauVar23;
        auVar11._16_16_ = auVar58;
        auVar11._0_16_ = auVar54;
        auVar12._16_16_ = auVar58;
        auVar12._0_16_ = auVar54;
        auVar13._16_16_ = auVar58;
        auVar13._0_16_ = auVar54;
        auVar60 = pmaddwd(auVar12._8_16_,auVar50);
        auVar63 = pmaddwd(auVar13._12_16_,auVar51);
        auVar14._16_16_ = auVar58;
        auVar14._0_16_ = auVar54;
        auVar15._16_16_ = auVar58;
        auVar15._0_16_ = auVar54;
        auVar16._16_16_ = auVar58;
        auVar16._0_16_ = auVar54;
        auVar17._16_16_ = auVar58;
        auVar17._0_16_ = auVar54;
        auVar58 = pmaddwd(auVar54,auVar37);
        auVar62 = pmaddwd(auVar11._4_16_,auVar53);
        auVar61 = pmaddwd(auVar14._2_16_,auVar37);
        auVar64 = pmaddwd(auVar15._6_16_,auVar53);
        auVar65 = pmaddwd(auVar16._10_16_,auVar50);
        auVar54 = pmaddwd(auVar17._14_16_,auVar51);
        auVar59._0_4_ =
             (auVar58._0_4_ + iVar35 + auVar62._0_4_ + auVar63._0_4_ + auVar60._0_4_ >> auVar48) +
             auVar36._0_4_ >> auVar49;
        auVar59._4_4_ =
             (auVar58._4_4_ + iVar35 + auVar62._4_4_ + auVar63._4_4_ + auVar60._4_4_ >> auVar48) +
             auVar36._0_4_ >> auVar49;
        auVar59._8_4_ =
             (auVar58._8_4_ + iVar35 + auVar62._8_4_ + auVar63._8_4_ + auVar60._8_4_ >> auVar48) +
             auVar36._0_4_ >> auVar49;
        auVar59._12_4_ =
             (auVar58._12_4_ + iVar35 + auVar62._12_4_ + auVar63._12_4_ + auVar60._12_4_ >> auVar48)
             + auVar36._0_4_ >> auVar49;
        auVar58 = packssdw(auVar59,auVar59);
        auVar60._0_4_ =
             (auVar61._0_4_ + iVar35 + auVar65._0_4_ + auVar64._0_4_ + auVar54._0_4_ >> auVar48) +
             auVar36._0_4_ >> auVar49;
        auVar60._4_4_ =
             (auVar61._4_4_ + iVar35 + auVar65._4_4_ + auVar64._4_4_ + auVar54._4_4_ >> auVar48) +
             auVar36._0_4_ >> auVar49;
        auVar60._8_4_ =
             (auVar61._8_4_ + iVar35 + auVar65._8_4_ + auVar64._8_4_ + auVar54._8_4_ >> auVar48) +
             auVar36._0_4_ >> auVar49;
        auVar60._12_4_ =
             (auVar61._12_4_ + iVar35 + auVar65._12_4_ + auVar64._12_4_ + auVar54._12_4_ >> auVar48)
             + auVar36._0_4_ >> auVar49;
        auVar54 = packssdw(auVar60,auVar60);
        sVar57 = auVar54._6_2_;
        sVar42 = auVar58._6_2_;
        sVar56 = auVar54._4_2_;
        sVar40 = auVar58._4_2_;
        sVar55 = auVar54._2_2_;
        sVar38 = auVar58._2_2_;
        sVar33 = auVar58._0_2_;
        sVar52 = auVar54._0_2_;
        uVar34 = (ushort)(local_178 < sVar33) * local_178 | (ushort)(local_178 >= sVar33) * sVar33;
        uVar39 = (ushort)(sStack_176 < sVar52) * sStack_176 |
                 (ushort)(sStack_176 >= sVar52) * sVar52;
        uVar41 = (ushort)(local_178 < sVar38) * local_178 | (ushort)(local_178 >= sVar38) * sVar38;
        uVar43 = (ushort)(sStack_176 < sVar55) * sStack_176 |
                 (ushort)(sStack_176 >= sVar55) * sVar55;
        uVar44 = (ushort)(local_178 < sVar40) * local_178 | (ushort)(local_178 >= sVar40) * sVar40;
        uVar45 = (ushort)(sStack_176 < sVar56) * sStack_176 |
                 (ushort)(sStack_176 >= sVar56) * sVar56;
        uVar46 = (ushort)(local_178 < sVar42) * local_178 | (ushort)(local_178 >= sVar42) * sVar42;
        uVar47 = (ushort)(sStack_176 < sVar57) * sStack_176 |
                 (ushort)(sStack_176 >= sVar57) * sVar57;
        uVar1 = (-1 < (short)uVar34) * uVar34;
        uVar2 = (-1 < (short)uVar39) * uVar39;
        uVar3 = (-1 < (short)uVar41) * uVar41;
        uVar4 = (-1 < (short)uVar43) * uVar43;
        if ((long)uVar28 < (long)w + -4) {
          *puVar29 = uVar1;
          puVar29[1] = uVar2;
          puVar29[2] = uVar3;
          puVar29[3] = uVar4;
          puVar29[4] = (-1 < (short)uVar44) * uVar44;
          puVar29[5] = (-1 < (short)uVar45) * uVar45;
          puVar29[6] = (-1 < (short)uVar46) * uVar46;
          puVar29[7] = (-1 < (short)uVar47) * uVar47;
        }
        else if (w == 4) {
          *puVar29 = uVar1;
          puVar29[1] = uVar2;
          puVar29[2] = uVar3;
          puVar29[3] = uVar4;
        }
        else {
          *puVar29 = uVar1;
          puVar29[1] = uVar2;
        }
        pauVar23 = (undefined1 (*) [16])(*pauVar23 + (long)src_stride * 2);
        puVar29 = puVar29 + dst_stride;
      }
      pauVar27 = pauVar27 + 1;
      dst = dst + 8;
      uVar28 = uVar28 + 8;
    }
  }
  return;
}

Assistant:

void av1_highbd_convolve_x_sr_ssse3(const uint16_t *src, int src_stride,
                                    uint16_t *dst, int dst_stride, int w, int h,
                                    const InterpFilterParams *filter_params_x,
                                    const int subpel_x_qn,
                                    ConvolveParams *conv_params, int bd) {
  int i, j;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_horiz;

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  const __m128i round_const_x =
      _mm_set1_epi32(((1 << conv_params->round_0) >> 1));
  const __m128i round_shift_x = _mm_cvtsi32_si128(conv_params->round_0);

  const int bits = FILTER_BITS - conv_params->round_0;

  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m128i round_const_bits = _mm_set1_epi32((1 << bits) >> 1);
  const __m128i clip_pixel =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m128i zero = _mm_setzero_si128();

  if (filter_params_x->taps == 12) {
    __m128i s[6], coeffs_x[6];

    prepare_coeffs_12tap(filter_params_x, subpel_x_qn, coeffs_x);

    for (j = 0; j < w; j += 8) {
      /* Horizontal filter */
      {
        for (i = 0; i < h; i += 1) {
          const __m128i row00 =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
          const __m128i row01 =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + (j + 8)]);
          const __m128i row02 =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + (j + 16)]);

          // even pixels
          s[0] = _mm_alignr_epi8(row01, row00, 0);
          s[1] = _mm_alignr_epi8(row01, row00, 4);
          s[2] = _mm_alignr_epi8(row01, row00, 8);
          s[3] = _mm_alignr_epi8(row01, row00, 12);
          s[4] = _mm_alignr_epi8(row02, row01, 0);
          s[5] = _mm_alignr_epi8(row02, row01, 4);

          __m128i res_even = convolve_12tap(s, coeffs_x);
          res_even = _mm_sra_epi32(_mm_add_epi32(res_even, round_const_x),
                                   round_shift_x);
          res_even = _mm_sra_epi32(_mm_add_epi32(res_even, round_const_bits),
                                   round_shift_bits);

          // odd pixels
          s[0] = _mm_alignr_epi8(row01, row00, 2);
          s[1] = _mm_alignr_epi8(row01, row00, 6);
          s[2] = _mm_alignr_epi8(row01, row00, 10);
          s[3] = _mm_alignr_epi8(row01, row00, 14);
          s[4] = _mm_alignr_epi8(row02, row01, 2);
          s[5] = _mm_alignr_epi8(row02, row01, 6);

          __m128i res_odd = convolve_12tap(s, coeffs_x);
          res_odd = _mm_sra_epi32(_mm_add_epi32(res_odd, round_const_x),
                                  round_shift_x);
          res_odd = _mm_sra_epi32(_mm_add_epi32(res_odd, round_const_bits),
                                  round_shift_bits);

          __m128i res_even1 = _mm_packs_epi32(res_even, res_even);
          __m128i res_odd1 = _mm_packs_epi32(res_odd, res_odd);
          __m128i res = _mm_unpacklo_epi16(res_even1, res_odd1);

          res = _mm_min_epi16(res, clip_pixel);
          res = _mm_max_epi16(res, zero);

          if (w - j > 4) {
            _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j], res);
          } else if (w == 4) {
            _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j], res);
          } else {
            *((int *)(&dst[i * dst_stride + j])) = _mm_cvtsi128_si32(res);
          }
        }
      }
    }
  } else {
    __m128i s[4], coeffs_x[4];
    prepare_coeffs(filter_params_x, subpel_x_qn, coeffs_x);

    for (j = 0; j < w; j += 8) {
      /* Horizontal filter */
      {
        for (i = 0; i < h; i += 1) {
          const __m128i row00 =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
          const __m128i row01 =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + (j + 8)]);

          // even pixels
          s[0] = _mm_alignr_epi8(row01, row00, 0);
          s[1] = _mm_alignr_epi8(row01, row00, 4);
          s[2] = _mm_alignr_epi8(row01, row00, 8);
          s[3] = _mm_alignr_epi8(row01, row00, 12);

          __m128i res_even = convolve(s, coeffs_x);
          res_even = _mm_sra_epi32(_mm_add_epi32(res_even, round_const_x),
                                   round_shift_x);

          // odd pixels
          s[0] = _mm_alignr_epi8(row01, row00, 2);
          s[1] = _mm_alignr_epi8(row01, row00, 6);
          s[2] = _mm_alignr_epi8(row01, row00, 10);
          s[3] = _mm_alignr_epi8(row01, row00, 14);

          __m128i res_odd = convolve(s, coeffs_x);
          res_odd = _mm_sra_epi32(_mm_add_epi32(res_odd, round_const_x),
                                  round_shift_x);

          res_even = _mm_sra_epi32(_mm_add_epi32(res_even, round_const_bits),
                                   round_shift_bits);
          res_odd = _mm_sra_epi32(_mm_add_epi32(res_odd, round_const_bits),
                                  round_shift_bits);

          __m128i res_even1 = _mm_packs_epi32(res_even, res_even);
          __m128i res_odd1 = _mm_packs_epi32(res_odd, res_odd);
          __m128i res = _mm_unpacklo_epi16(res_even1, res_odd1);

          res = _mm_min_epi16(res, clip_pixel);
          res = _mm_max_epi16(res, zero);

          if (w - j > 4) {
            _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j], res);
          } else if (w == 4) {
            _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j], res);
          } else {
            *((int *)(&dst[i * dst_stride + j])) = _mm_cvtsi128_si32(res);
          }
        }
      }
    }
  }
}